

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_asn1.cc
# Opt level: O0

UniquePtr<SSL_SESSION> __thiscall
bssl::SSL_SESSION_parse(bssl *this,CBS *cbs,SSL_X509_METHOD *x509_method,CRYPTO_BUFFER_POOL *pool)

{
  _func_bool_SSL_SESSION_ptr *p_Var1;
  bool bVar2;
  enable_if_t<_internal::StackTraits<stack_st_CRYPTO_BUFFER>::kIsConst,_bool> eVar3;
  int iVar4;
  pointer psVar5;
  size_t sVar6;
  SSL_CIPHER *pSVar7;
  uint8_t *src;
  stack_st_CRYPTO_BUFFER *__p;
  CRYPTO_BUFFER *pCVar8;
  pointer psVar9;
  pointer psVar10;
  Span<const_unsigned_char> SVar11;
  byte local_3d1;
  byte local_391;
  int local_1f4;
  int local_1f0;
  int is_resumable_across_names;
  int has_peer_alps;
  int has_local_alps;
  CBS settings;
  int local_1d0;
  int is_quic;
  int is_server;
  int age_add_present;
  CBS age_add;
  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> local_1b0;
  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> local_1a8;
  UniquePtr<CRYPTO_BUFFER> buffer_1;
  CBS cert;
  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> local_188;
  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> local_180;
  UniquePtr<CRYPTO_BUFFER> buffer;
  undefined1 local_170 [4];
  int has_cert_chain;
  CBS cert_chain;
  int extended_master_secret;
  undefined1 local_148 [8];
  CBS original_handshake_hash;
  CBS peer_sha256;
  CBS unused_hostname;
  undefined1 local_108 [8];
  CBS sid_ctx;
  undefined1 local_f0 [4];
  int has_peer;
  CBS peer;
  uint32_t local_c0;
  undefined4 uStack_bc;
  uint64_t timeout;
  CBS child;
  CBS secret;
  CBS session_id;
  undefined1 local_80 [6];
  uint16_t cipher_value;
  CBS cipher;
  uint16_t local_5a;
  uint16_t uStack_58;
  undefined1 auStack_56 [4];
  uint16_t unused;
  uint64_t ssl_version;
  uint64_t version;
  CBS session;
  unique_ptr<ssl_session_st,_bssl::internal::Deleter> local_30;
  UniquePtr<SSL_SESSION> ret;
  CRYPTO_BUFFER_POOL *pool_local;
  SSL_X509_METHOD *x509_method_local;
  CBS *cbs_local;
  
  ret._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)pool;
  ssl_session_new((bssl *)&local_30,x509_method);
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_30);
  if (!bVar2) {
    std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
    unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
    session.len._4_4_ = 1;
    goto LAB_0018faf9;
  }
  iVar4 = CBS_get_asn1(cbs,(CBS *)&version,0x20000010);
  if (((((iVar4 == 0) || (iVar4 = CBS_get_asn1_uint64((CBS *)&version,&ssl_version), iVar4 == 0)) ||
       (ssl_version != 1)) ||
      ((iVar4 = CBS_get_asn1_uint64((CBS *)&version,(uint64_t *)&uStack_58), iVar4 == 0 ||
       (0xffff < CONCAT62(_auStack_56,uStack_58))))) ||
     (bVar2 = ssl_protocol_version_from_wire(&local_5a,uStack_58), !bVar2)) {
    ERR_put_error(0x10,0,0xa0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                  ,0x1e1);
    std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
    unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
    session.len._4_4_ = 1;
    goto LAB_0018faf9;
  }
  psVar5 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_30);
  psVar5->ssl_version = uStack_58;
  iVar4 = CBS_get_asn1((CBS *)&version,(CBS *)local_80,4);
  if (((iVar4 == 0) ||
      (iVar4 = CBS_get_u16((CBS *)local_80,(uint16_t *)((long)&session_id.len + 6)), iVar4 == 0)) ||
     (sVar6 = CBS_len((CBS *)local_80), sVar6 != 0)) {
    ERR_put_error(0x10,0,0xa0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                  ,0x1eb);
    std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
    unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
    session.len._4_4_ = 1;
    goto LAB_0018faf9;
  }
  pSVar7 = SSL_get_cipher_by_value(session_id.len._6_2_);
  psVar5 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_30);
  psVar5->cipher = pSVar7;
  psVar5 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_30);
  if (psVar5->cipher == (SSL_CIPHER *)0x0) {
    ERR_put_error(0x10,0,0xed,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                  ,0x1f0);
    std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
    unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
    session.len._4_4_ = 1;
    goto LAB_0018faf9;
  }
  iVar4 = CBS_get_asn1((CBS *)&version,(CBS *)&secret.len,4);
  if (iVar4 != 0) {
    psVar5 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_30);
    SVar11 = cbs_st::operator_cast_to_Span((cbs_st *)&secret.len);
    bVar2 = InplaceVector<unsigned_char,_32UL>::TryCopyFrom(&psVar5->session_id,SVar11);
    if ((bVar2) && (iVar4 = CBS_get_asn1((CBS *)&version,(CBS *)&child.len,4), iVar4 != 0)) {
      psVar5 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_30);
      SVar11 = cbs_st::operator_cast_to_Span((cbs_st *)&child.len);
      peer.len = (size_t)SVar11.data_;
      bVar2 = InplaceVector<unsigned_char,_64UL>::TryCopyFrom(&psVar5->secret,SVar11);
      if ((bVar2) && (iVar4 = CBS_get_asn1((CBS *)&version,(CBS *)&timeout,0xa0000001), iVar4 != 0))
      {
        psVar5 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_30);
        iVar4 = CBS_get_asn1_uint64((CBS *)&timeout,&psVar5->time);
        if ((((iVar4 != 0) &&
             (iVar4 = CBS_get_asn1((CBS *)&version,(CBS *)&timeout,0xa0000002), iVar4 != 0)) &&
            (iVar4 = CBS_get_asn1_uint64((CBS *)&timeout,(uint64_t *)&local_c0), iVar4 != 0)) &&
           (CONCAT44(uStack_bc,local_c0) < 0x100000000)) {
          psVar5 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_30);
          psVar5->timeout = local_c0;
          iVar4 = CBS_get_optional_asn1
                            ((CBS *)&version,(CBS *)local_f0,(int *)((long)&sid_ctx.len + 4),
                             0xa0000003);
          if ((iVar4 == 0) ||
             ((sid_ctx.len._4_4_ != 0 && (sVar6 = CBS_len((CBS *)local_f0), sVar6 == 0)))) {
            ERR_put_error(0x10,0,0xa0,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                          ,0x209);
            std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
            unique_ptr<bssl::internal::Deleter,void>
                      ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
            session.len._4_4_ = 1;
            goto LAB_0018faf9;
          }
          iVar4 = CBS_get_optional_asn1_octet_string
                            ((CBS *)&version,(CBS *)local_108,(int *)0x0,0xa0000004);
          if (iVar4 != 0) {
            psVar5 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_30)
            ;
            SVar11 = cbs_st::operator_cast_to_Span((cbs_st *)local_108);
            bVar2 = InplaceVector<unsigned_char,_32UL>::TryCopyFrom(&psVar5->sid_ctx,SVar11);
            if (bVar2) {
              psVar5 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                                 (&local_30);
              iVar4 = SSL_SESSION_parse_long((CBS *)&version,&psVar5->verify_result,0xa0000005,0);
              if (iVar4 != 0) {
                iVar4 = CBS_get_optional_asn1
                                  ((CBS *)&version,(CBS *)&peer_sha256.len,(int *)0x0,0xa0000006);
                if (iVar4 == 0) {
                  ERR_put_error(0x10,0,0xa0,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                ,0x21b);
                  std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
                  unique_ptr<bssl::internal::Deleter,void>
                            ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)this,
                             (nullptr_t)0x0);
                  session.len._4_4_ = 1;
                  goto LAB_0018faf9;
                }
                psVar5 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                                   (&local_30);
                iVar4 = SSL_SESSION_parse_string((CBS *)&version,&psVar5->psk_identity,0xa0000008);
                if (iVar4 != 0) {
                  psVar5 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                                     (&local_30);
                  iVar4 = SSL_SESSION_parse_u32
                                    ((CBS *)&version,&psVar5->ticket_lifetime_hint,0xa0000009,0);
                  if (iVar4 != 0) {
                    psVar5 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                                       (&local_30);
                    bVar2 = SSL_SESSION_parse_octet_string
                                      ((CBS *)&version,&psVar5->ticket,0xa000000a);
                    if (bVar2) {
                      iVar4 = CBS_peek_asn1_tag((CBS *)&version,0xa000000d);
                      if (iVar4 == 0) {
                        psVar5 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::
                                 operator->(&local_30);
                        psVar5->field_0x1b8 = psVar5->field_0x1b8 & 0xfd;
                      }
                      else {
                        iVar4 = CBS_get_asn1((CBS *)&version,(CBS *)&timeout,0xa000000d);
                        if (((iVar4 == 0) ||
                            (iVar4 = CBS_get_asn1((CBS *)&timeout,
                                                  (CBS *)&original_handshake_hash.len,4), iVar4 == 0
                            )) || ((sVar6 = CBS_len((CBS *)&original_handshake_hash.len),
                                   sVar6 != 0x20 || (sVar6 = CBS_len((CBS *)&timeout), sVar6 != 0)))
                           ) {
                          ERR_put_error(0x10,0,0xa0,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                        ,0x22d);
                          std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
                          unique_ptr<bssl::internal::Deleter,void>
                                    ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)this,
                                     (nullptr_t)0x0);
                          session.len._4_4_ = 1;
                          goto LAB_0018faf9;
                        }
                        psVar5 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::
                                 operator->(&local_30);
                        src = CBS_data((CBS *)&original_handshake_hash.len);
                        ::OPENSSL_memcpy(psVar5->peer_sha256,src,0x20);
                        psVar5 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::
                                 operator->(&local_30);
                        psVar5->field_0x1b8 = psVar5->field_0x1b8 & 0xfd | 2;
                      }
                      iVar4 = CBS_get_optional_asn1_octet_string
                                        ((CBS *)&version,(CBS *)local_148,(int *)0x0,0xa000000e);
                      if (iVar4 != 0) {
                        psVar5 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::
                                 operator->(&local_30);
                        SVar11 = cbs_st::operator_cast_to_Span((cbs_st *)local_148);
                        bVar2 = InplaceVector<unsigned_char,_64UL>::TryCopyFrom
                                          (&psVar5->original_handshake_hash,SVar11);
                        if (bVar2) {
                          psVar5 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::
                                   operator->(&local_30);
                          iVar4 = SSL_SESSION_parse_crypto_buffer
                                            ((CBS *)&version,&psVar5->signed_cert_timestamp_list,
                                             0xa000000f,
                                             (CRYPTO_BUFFER_POOL *)
                                             ret._M_t.
                                             super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                             .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                             _M_head_impl);
                          if (iVar4 != 0) {
                            psVar5 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::
                                     operator->(&local_30);
                            iVar4 = SSL_SESSION_parse_crypto_buffer
                                              ((CBS *)&version,&psVar5->ocsp_response,0xa0000010,
                                               (CRYPTO_BUFFER_POOL *)
                                               ret._M_t.
                                               super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                               .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                               _M_head_impl);
                            if (iVar4 != 0) {
                              iVar4 = CBS_get_optional_asn1_bool
                                                ((CBS *)&version,(int *)((long)&cert_chain.len + 4),
                                                 0xa0000011,0);
                              if (iVar4 == 0) {
                                ERR_put_error(0x10,0,0xa0,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                              ,0x248);
                                std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
                                unique_ptr<bssl::internal::Deleter,void>
                                          ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)
                                           this,(nullptr_t)0x0);
                                session.len._4_4_ = 1;
                                goto LAB_0018faf9;
                              }
                              psVar5 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::
                                       operator->(&local_30);
                              psVar5->field_0x1b8 =
                                   psVar5->field_0x1b8 & 0xfe | cert_chain.len._4_4_ != 0;
                              psVar5 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::
                                       operator->(&local_30);
                              iVar4 = SSL_SESSION_parse_u16
                                                ((CBS *)&version,&psVar5->group_id,0xa0000012,0);
                              if (iVar4 == 0) {
                                ERR_put_error(0x10,0,0xa0,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                              ,0x24e);
                                std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
                                unique_ptr<bssl::internal::Deleter,void>
                                          ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)
                                           this,(nullptr_t)0x0);
                                session.len._4_4_ = 1;
                                goto LAB_0018faf9;
                              }
                              CBS_init((CBS *)local_170,(uint8_t *)0x0,0);
                              iVar4 = CBS_get_optional_asn1
                                                ((CBS *)&version,(CBS *)local_170,
                                                 (int *)((long)&buffer._M_t.
                                                                                                                                
                                                  super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_crypto_buffer_st_*,_false>.
                                                  _M_head_impl + 4),0xa0000013);
                              if ((iVar4 == 0) ||
                                 ((buffer._M_t.
                                   super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl.
                                   _4_4_ != 0 && (sVar6 = CBS_len((CBS *)local_170), sVar6 == 0))))
                              {
                                ERR_put_error(0x10,0,0xa0,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                              ,600);
                                std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
                                unique_ptr<bssl::internal::Deleter,void>
                                          ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)
                                           this,(nullptr_t)0x0);
                                session.len._4_4_ = 1;
                                goto LAB_0018faf9;
                              }
                              if ((buffer._M_t.
                                   super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl.
                                   _4_4_ != 0) && (sid_ctx.len._4_4_ == 0)) {
                                ERR_put_error(0x10,0,0xa0,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                              ,0x25c);
                                std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
                                unique_ptr<bssl::internal::Deleter,void>
                                          ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)
                                           this,(nullptr_t)0x0);
                                session.len._4_4_ = 1;
                                goto LAB_0018faf9;
                              }
                              if ((sid_ctx.len._4_4_ != 0) ||
                                 (buffer._M_t.
                                  super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                  .super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl.
                                  _4_4_ != 0)) {
                                psVar5 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::
                                         operator->(&local_30);
                                __p = sk_CRYPTO_BUFFER_new_null();
                                std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::
                                reset(&psVar5->certs,__p);
                                psVar5 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::
                                         operator->(&local_30);
                                bVar2 = std::operator==(&psVar5->certs,(nullptr_t)0x0);
                                if (bVar2) {
                                  std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
                                  unique_ptr<bssl::internal::Deleter,void>
                                            ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)
                                             this,(nullptr_t)0x0);
                                  session.len._4_4_ = 1;
                                }
                                else {
                                  if (sid_ctx.len._4_4_ != 0) {
                                    pCVar8 = CRYPTO_BUFFER_new_from_CBS
                                                       ((CBS *)local_f0,
                                                        (CRYPTO_BUFFER_POOL *)
                                                        ret._M_t.
                                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                  _M_head_impl);
                                    std::unique_ptr<crypto_buffer_st,bssl::internal::Deleter>::
                                    unique_ptr<bssl::internal::Deleter,void>
                                              ((unique_ptr<crypto_buffer_st,bssl::internal::Deleter>
                                                *)&local_180,pCVar8);
                                    bVar2 = std::unique_ptr::operator_cast_to_bool
                                                      ((unique_ptr *)&local_180);
                                    local_391 = 1;
                                    if (bVar2) {
                                      psVar5 = std::
                                               unique_ptr<ssl_session_st,_bssl::internal::Deleter>::
                                               operator->(&local_30);
                                      psVar9 = std::
                                               unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                                               ::get(&psVar5->certs);
                                      std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::
                                      unique_ptr(&local_188,&local_180);
                                      eVar3 = PushToStack<stack_st_CRYPTO_BUFFER>(psVar9,&local_188)
                                      ;
                                      local_391 = eVar3 ^ 0xff;
                                      std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::
                                      ~unique_ptr(&local_188);
                                    }
                                    bVar2 = (local_391 & 1) != 0;
                                    if (bVar2) {
                                      std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
                                      unique_ptr<bssl::internal::Deleter,void>
                                                ((unique_ptr<ssl_session_st,bssl::internal::Deleter>
                                                  *)this,(nullptr_t)0x0);
                                    }
                                    session.len._5_3_ = 0;
                                    session.len._4_1_ = bVar2;
                                    std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::
                                    ~unique_ptr(&local_180);
                                    if (session.len._4_4_ != 0) goto LAB_0018faf9;
                                  }
                                  do {
                                    sVar6 = CBS_len((CBS *)local_170);
                                    if (sVar6 == 0) goto LAB_0018f443;
                                    iVar4 = CBS_get_any_asn1_element
                                                      ((CBS *)local_170,(CBS *)&buffer_1,
                                                       (CBS_ASN1_TAG *)0x0,(size_t *)0x0);
                                    if ((iVar4 == 0) ||
                                       (sVar6 = CBS_len((CBS *)&buffer_1), sVar6 == 0)) {
                                      ERR_put_error(0x10,0,0xa0,
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                                  ,0x271);
                                      std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
                                      unique_ptr<bssl::internal::Deleter,void>
                                                ((unique_ptr<ssl_session_st,bssl::internal::Deleter>
                                                  *)this,(nullptr_t)0x0);
                                      session.len._4_4_ = 1;
                                      break;
                                    }
                                    pCVar8 = CRYPTO_BUFFER_new_from_CBS
                                                       ((CBS *)&buffer_1,
                                                        (CRYPTO_BUFFER_POOL *)
                                                        ret._M_t.
                                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                  _M_head_impl);
                                    std::unique_ptr<crypto_buffer_st,bssl::internal::Deleter>::
                                    unique_ptr<bssl::internal::Deleter,void>
                                              ((unique_ptr<crypto_buffer_st,bssl::internal::Deleter>
                                                *)&local_1a8,pCVar8);
                                    bVar2 = std::operator==(&local_1a8,(nullptr_t)0x0);
                                    age_add.len._7_1_ = 0;
                                    local_3d1 = 1;
                                    if (!bVar2) {
                                      psVar5 = std::
                                               unique_ptr<ssl_session_st,_bssl::internal::Deleter>::
                                               operator->(&local_30);
                                      psVar9 = std::
                                               unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                                               ::get(&psVar5->certs);
                                      std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::
                                      unique_ptr(&local_1b0,&local_1a8);
                                      age_add.len._7_1_ = 1;
                                      eVar3 = PushToStack<stack_st_CRYPTO_BUFFER>(psVar9,&local_1b0)
                                      ;
                                      local_3d1 = eVar3 ^ 0xff;
                                    }
                                    if ((age_add.len._7_1_ & 1) != 0) {
                                      std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::
                                      ~unique_ptr(&local_1b0);
                                    }
                                    bVar2 = (local_3d1 & 1) != 0;
                                    if (bVar2) {
                                      std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
                                      unique_ptr<bssl::internal::Deleter,void>
                                                ((unique_ptr<ssl_session_st,bssl::internal::Deleter>
                                                  *)this,(nullptr_t)0x0);
                                    }
                                    session.len._5_3_ = 0;
                                    session.len._4_1_ = bVar2;
                                    std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::
                                    ~unique_ptr(&local_1a8);
                                  } while (session.len._4_4_ == 0);
                                }
                                goto LAB_0018faf9;
                              }
LAB_0018f443:
                              iVar4 = CBS_get_optional_asn1_octet_string
                                                ((CBS *)&version,(CBS *)&is_server,&is_quic,
                                                 0xa0000015);
                              if (iVar4 != 0) {
                                if (is_quic != 0) {
                                  psVar5 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>
                                           ::operator->(&local_30);
                                  iVar4 = CBS_get_u32((CBS *)&is_server,&psVar5->ticket_age_add);
                                  if (iVar4 == 0) goto LAB_0018f4cf;
                                }
                                sVar6 = CBS_len((CBS *)&is_server);
                                if (sVar6 == 0) {
                                  psVar5 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>
                                           ::operator->(&local_30);
                                  psVar5->field_0x1b8 =
                                       psVar5->field_0x1b8 & 0xf7 | (is_quic != 0) << 3;
                                  iVar4 = CBS_get_optional_asn1_bool
                                                    ((CBS *)&version,&local_1d0,0xa0000016,1);
                                  if (iVar4 == 0) {
                                    ERR_put_error(0x10,0,0xa0,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                                  ,0x28b);
                                    std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
                                    unique_ptr<bssl::internal::Deleter,void>
                                              ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *
                                               )this,(nullptr_t)0x0);
                                    session.len._4_4_ = 1;
                                    goto LAB_0018faf9;
                                  }
                                  psVar5 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>
                                           ::operator->(&local_30);
                                  psVar5->field_0x1b8 =
                                       psVar5->field_0x1b8 & 0xef | (local_1d0 != 0) << 4;
                                  psVar5 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>
                                           ::operator->(&local_30);
                                  iVar4 = SSL_SESSION_parse_u16
                                                    ((CBS *)&version,
                                                     &psVar5->peer_signature_algorithm,0xa0000017,0)
                                  ;
                                  if (iVar4 != 0) {
                                    psVar5 = std::
                                             unique_ptr<ssl_session_st,_bssl::internal::Deleter>::
                                             operator->(&local_30);
                                    iVar4 = SSL_SESSION_parse_u32
                                                      ((CBS *)&version,
                                                       &psVar5->ticket_max_early_data,0xa0000018,0);
                                    if (iVar4 != 0) {
                                      psVar5 = std::
                                               unique_ptr<ssl_session_st,_bssl::internal::Deleter>::
                                               operator->(&local_30);
                                      psVar10 = std::
                                                unique_ptr<ssl_session_st,_bssl::internal::Deleter>
                                                ::operator->(&local_30);
                                      iVar4 = SSL_SESSION_parse_u32
                                                        ((CBS *)&version,&psVar5->auth_timeout,
                                                         0xa0000019,psVar10->timeout);
                                      if (iVar4 != 0) {
                                        psVar5 = std::
                                                 unique_ptr<ssl_session_st,_bssl::internal::Deleter>
                                                 ::operator->(&local_30);
                                        bVar2 = SSL_SESSION_parse_octet_string
                                                          ((CBS *)&version,&psVar5->early_alpn,
                                                           0xa000001a);
                                        if ((bVar2) &&
                                           (iVar4 = CBS_get_optional_asn1_bool
                                                              ((CBS *)&version,
                                                               (int *)((long)&settings.len + 4),
                                                               0xa000001b,0), iVar4 != 0)) {
                                          psVar5 = std::
                                                  unique_ptr<ssl_session_st,_bssl::internal::Deleter>
                                                  ::operator->(&local_30);
                                          bVar2 = SSL_SESSION_parse_octet_string
                                                            ((CBS *)&version,
                                                             &psVar5->quic_early_data_context,
                                                             0xa000001c);
                                          if (bVar2) {
                                            iVar4 = CBS_get_optional_asn1_octet_string
                                                              ((CBS *)&version,(CBS *)&has_peer_alps
                                                               ,&is_resumable_across_names,
                                                               0xa000001d);
                                            if (iVar4 != 0) {
                                              psVar5 = std::
                                                  unique_ptr<ssl_session_st,_bssl::internal::Deleter>
                                                  ::operator->(&local_30);
                                              SVar11 = cbs_st::operator_cast_to_Span
                                                                 ((cbs_st *)&has_peer_alps);
                                              bVar2 = Array<unsigned_char>::CopyFrom
                                                                (&psVar5->local_application_settings
                                                                 ,SVar11);
                                              if ((bVar2) &&
                                                 (iVar4 = CBS_get_optional_asn1_octet_string
                                                                    ((CBS *)&version,
                                                                     (CBS *)&has_peer_alps,
                                                                     &local_1f0,0xa000001e),
                                                 iVar4 != 0)) {
                                                psVar5 = std::
                                                  unique_ptr<ssl_session_st,_bssl::internal::Deleter>
                                                  ::operator->(&local_30);
                                                SVar11 = cbs_st::operator_cast_to_Span
                                                                   ((cbs_st *)&has_peer_alps);
                                                bVar2 = Array<unsigned_char>::CopyFrom
                                                                  (&psVar5->
                                                  peer_application_settings,SVar11);
                                                if ((bVar2) &&
                                                   ((iVar4 = CBS_get_optional_asn1_bool
                                                                       ((CBS *)&version,&local_1f4,
                                                                        0xa000001f,0), iVar4 != 0 &&
                                                    (sVar6 = CBS_len((CBS *)&version), sVar6 == 0)))
                                                   ) {
                                                  psVar5 = std::
                                                  unique_ptr<ssl_session_st,_bssl::internal::Deleter>
                                                  ::operator->(&local_30);
                                                  psVar5->field_0x1b8 =
                                                       psVar5->field_0x1b8 & 0xdf |
                                                       (settings.len._4_4_ != 0) << 5;
                                                  psVar5 = std::
                                                  unique_ptr<ssl_session_st,_bssl::internal::Deleter>
                                                  ::operator->(&local_30);
                                                  psVar5->field_0x1b8 =
                                                       psVar5->field_0x1b8 & 0x7f |
                                                       (local_1f4 != 0) << 7;
                                                  if (is_resumable_across_names == local_1f0) {
                                                    if (is_resumable_across_names != 0) {
                                                      psVar5 = std::
                                                  unique_ptr<ssl_session_st,_bssl::internal::Deleter>
                                                  ::operator->(&local_30);
                                                  bVar2 = Array<unsigned_char>::empty
                                                                    (&psVar5->early_alpn);
                                                  if (bVar2) goto LAB_0018f9f7;
                                                  }
                                                  psVar5 = std::
                                                  unique_ptr<ssl_session_st,_bssl::internal::Deleter>
                                                  ::operator->(&local_30);
                                                  psVar5->field_0x1b8 =
                                                       psVar5->field_0x1b8 & 0xbf |
                                                       (is_resumable_across_names != 0) << 6;
                                                  p_Var1 = x509_method->session_cache_objects;
                                                  psVar5 = std::
                                                  unique_ptr<ssl_session_st,_bssl::internal::Deleter>
                                                  ::get(&local_30);
                                                  bVar2 = (*p_Var1)(psVar5);
                                                  if (bVar2) {
                                                    std::
                                                  unique_ptr<ssl_session_st,_bssl::internal::Deleter>
                                                  ::unique_ptr((
                                                  unique_ptr<ssl_session_st,_bssl::internal::Deleter>
                                                  *)this,&local_30);
                                                  session.len._4_4_ = 1;
                                                  }
                                                  else {
                                                    ERR_put_error(0x10,0,0xa0,
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                                  ,0x2bf);
                                                  std::
                                                  unique_ptr<ssl_session_st,bssl::internal::Deleter>
                                                  ::unique_ptr<bssl::internal::Deleter,void>
                                                            ((
                                                  unique_ptr<ssl_session_st,bssl::internal::Deleter>
                                                  *)this,(nullptr_t)0x0);
                                                  session.len._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
LAB_0018f9f7:
                                                    ERR_put_error(0x10,0,0xa0,
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                                  ,0x2b9);
                                                  std::
                                                  unique_ptr<ssl_session_st,bssl::internal::Deleter>
                                                  ::unique_ptr<bssl::internal::Deleter,void>
                                                            ((
                                                  unique_ptr<ssl_session_st,bssl::internal::Deleter>
                                                  *)this,(nullptr_t)0x0);
                                                  session.len._4_4_ = 1;
                                                  }
                                                  goto LAB_0018faf9;
                                                }
                                              }
                                            }
                                            ERR_put_error(0x10,0,0xa0,
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                                  ,0x2b0);
                                            std::unique_ptr<ssl_session_st,bssl::internal::Deleter>
                                            ::unique_ptr<bssl::internal::Deleter,void>
                                                      ((
                                                  unique_ptr<ssl_session_st,bssl::internal::Deleter>
                                                  *)this,(nullptr_t)0x0);
                                            session.len._4_4_ = 1;
                                            goto LAB_0018faf9;
                                          }
                                        }
                                      }
                                    }
                                  }
                                  ERR_put_error(0x10,0,0xa0,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                                ,0x2a0);
                                  std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
                                  unique_ptr<bssl::internal::Deleter,void>
                                            ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)
                                             this,(nullptr_t)0x0);
                                  session.len._4_4_ = 1;
                                  goto LAB_0018faf9;
                                }
                              }
LAB_0018f4cf:
                              std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
                              unique_ptr<bssl::internal::Deleter,void>
                                        ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)this,
                                         (nullptr_t)0x0);
                              session.len._4_4_ = 1;
                              goto LAB_0018faf9;
                            }
                          }
                        }
                      }
                      std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
                      unique_ptr<bssl::internal::Deleter,void>
                                ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)this,
                                 (nullptr_t)0x0);
                      session.len._4_4_ = 1;
                      goto LAB_0018faf9;
                    }
                  }
                }
                std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
                unique_ptr<bssl::internal::Deleter,void>
                          ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0
                          );
                session.len._4_4_ = 1;
                goto LAB_0018faf9;
              }
            }
          }
          std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
          unique_ptr<bssl::internal::Deleter,void>
                    ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
          session.len._4_4_ = 1;
          goto LAB_0018faf9;
        }
      }
    }
  }
  ERR_put_error(0x10,0,0xa0,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                ,0x1ff);
  std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
  session.len._4_4_ = 1;
LAB_0018faf9:
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&local_30);
  return (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

UniquePtr<SSL_SESSION> SSL_SESSION_parse(CBS *cbs,
                                         const SSL_X509_METHOD *x509_method,
                                         CRYPTO_BUFFER_POOL *pool) {
  UniquePtr<SSL_SESSION> ret = ssl_session_new(x509_method);
  if (!ret) {
    return nullptr;
  }

  CBS session;
  uint64_t version, ssl_version;
  uint16_t unused;
  if (!CBS_get_asn1(cbs, &session, CBS_ASN1_SEQUENCE) ||  //
      !CBS_get_asn1_uint64(&session, &version) ||         //
      version != kVersion ||                              //
      !CBS_get_asn1_uint64(&session, &ssl_version) ||     //
      // Require sessions have versions valid in either TLS or DTLS. The session
      // will not be used by the handshake if not applicable, but, for
      // simplicity, never parse a session that does not pass
      // |ssl_protocol_version_from_wire|.
      ssl_version > UINT16_MAX ||  //
      !ssl_protocol_version_from_wire(&unused, ssl_version)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }
  ret->ssl_version = ssl_version;

  CBS cipher;
  uint16_t cipher_value;
  if (!CBS_get_asn1(&session, &cipher, CBS_ASN1_OCTETSTRING) ||  //
      !CBS_get_u16(&cipher, &cipher_value) ||                    //
      CBS_len(&cipher) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }
  ret->cipher = SSL_get_cipher_by_value(cipher_value);
  if (ret->cipher == NULL) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNSUPPORTED_CIPHER);
    return nullptr;
  }

  CBS session_id, secret, child;
  uint64_t timeout;
  if (!CBS_get_asn1(&session, &session_id, CBS_ASN1_OCTETSTRING) ||
      !ret->session_id.TryCopyFrom(session_id) ||
      !CBS_get_asn1(&session, &secret, CBS_ASN1_OCTETSTRING) ||
      !ret->secret.TryCopyFrom(secret) ||
      !CBS_get_asn1(&session, &child, kTimeTag) ||
      !CBS_get_asn1_uint64(&child, &ret->time) ||
      !CBS_get_asn1(&session, &child, kTimeoutTag) ||
      !CBS_get_asn1_uint64(&child, &timeout) ||  //
      timeout > UINT32_MAX) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }

  ret->timeout = (uint32_t)timeout;

  CBS peer;
  int has_peer;
  if (!CBS_get_optional_asn1(&session, &peer, &has_peer, kPeerTag) ||
      (has_peer && CBS_len(&peer) == 0)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }
  // |peer| is processed with the certificate chain.

  CBS sid_ctx;
  if (!CBS_get_optional_asn1_octet_string(
          &session, &sid_ctx, /*out_present=*/nullptr, kSessionIDContextTag) ||
      !ret->sid_ctx.TryCopyFrom(sid_ctx) ||
      !SSL_SESSION_parse_long(&session, &ret->verify_result, kVerifyResultTag,
                              X509_V_OK)) {
    return nullptr;
  }

  // Skip the historical hostName field.
  CBS unused_hostname;
  if (!CBS_get_optional_asn1(&session, &unused_hostname, nullptr,
                             kHostNameTag)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }

  if (!SSL_SESSION_parse_string(&session, &ret->psk_identity,
                                kPSKIdentityTag) ||
      !SSL_SESSION_parse_u32(&session, &ret->ticket_lifetime_hint,
                             kTicketLifetimeHintTag, 0) ||
      !SSL_SESSION_parse_octet_string(&session, &ret->ticket, kTicketTag)) {
    return nullptr;
  }

  if (CBS_peek_asn1_tag(&session, kPeerSHA256Tag)) {
    CBS peer_sha256;
    if (!CBS_get_asn1(&session, &child, kPeerSHA256Tag) ||
        !CBS_get_asn1(&child, &peer_sha256, CBS_ASN1_OCTETSTRING) ||
        CBS_len(&peer_sha256) != sizeof(ret->peer_sha256) ||
        CBS_len(&child) != 0) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
      return nullptr;
    }
    OPENSSL_memcpy(ret->peer_sha256, CBS_data(&peer_sha256),
                   sizeof(ret->peer_sha256));
    ret->peer_sha256_valid = true;
  } else {
    ret->peer_sha256_valid = false;
  }

  CBS original_handshake_hash;
  if (!CBS_get_optional_asn1_octet_string(&session, &original_handshake_hash,
                                          /*out_present=*/nullptr,
                                          kOriginalHandshakeHashTag) ||
      !ret->original_handshake_hash.TryCopyFrom(original_handshake_hash) ||
      !SSL_SESSION_parse_crypto_buffer(&session,
                                       &ret->signed_cert_timestamp_list,
                                       kSignedCertTimestampListTag, pool) ||
      !SSL_SESSION_parse_crypto_buffer(&session, &ret->ocsp_response,
                                       kOCSPResponseTag, pool)) {
    return nullptr;
  }

  int extended_master_secret;
  if (!CBS_get_optional_asn1_bool(&session, &extended_master_secret,
                                  kExtendedMasterSecretTag,
                                  0 /* default to false */)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }
  ret->extended_master_secret = !!extended_master_secret;

  if (!SSL_SESSION_parse_u16(&session, &ret->group_id, kGroupIDTag, 0)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }

  CBS cert_chain;
  CBS_init(&cert_chain, NULL, 0);
  int has_cert_chain;
  if (!CBS_get_optional_asn1(&session, &cert_chain, &has_cert_chain,
                             kCertChainTag) ||
      (has_cert_chain && CBS_len(&cert_chain) == 0)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }
  if (has_cert_chain && !has_peer) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }
  if (has_peer || has_cert_chain) {
    ret->certs.reset(sk_CRYPTO_BUFFER_new_null());
    if (ret->certs == nullptr) {
      return nullptr;
    }

    if (has_peer) {
      UniquePtr<CRYPTO_BUFFER> buffer(CRYPTO_BUFFER_new_from_CBS(&peer, pool));
      if (!buffer ||  //
          !PushToStack(ret->certs.get(), std::move(buffer))) {
        return nullptr;
      }
    }

    while (CBS_len(&cert_chain) > 0) {
      CBS cert;
      if (!CBS_get_any_asn1_element(&cert_chain, &cert, NULL, NULL) ||
          CBS_len(&cert) == 0) {
        OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
        return nullptr;
      }

      UniquePtr<CRYPTO_BUFFER> buffer(CRYPTO_BUFFER_new_from_CBS(&cert, pool));
      if (buffer == nullptr ||
          !PushToStack(ret->certs.get(), std::move(buffer))) {
        return nullptr;
      }
    }
  }

  CBS age_add;
  int age_add_present;
  if (!CBS_get_optional_asn1_octet_string(&session, &age_add, &age_add_present,
                                          kTicketAgeAddTag) ||
      (age_add_present &&                                //
       !CBS_get_u32(&age_add, &ret->ticket_age_add)) ||  //
      CBS_len(&age_add) != 0) {
    return nullptr;
  }
  ret->ticket_age_add_valid = age_add_present != 0;

  int is_server;
  if (!CBS_get_optional_asn1_bool(&session, &is_server, kIsServerTag,
                                  1 /* default to true */)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }
  /* TODO: in time we can include |is_server| for servers too, then we can
     enforce that client and server sessions are never mixed up. */

  ret->is_server = is_server;

  int is_quic;
  if (!SSL_SESSION_parse_u16(&session, &ret->peer_signature_algorithm,
                             kPeerSignatureAlgorithmTag, 0) ||
      !SSL_SESSION_parse_u32(&session, &ret->ticket_max_early_data,
                             kTicketMaxEarlyDataTag, 0) ||
      !SSL_SESSION_parse_u32(&session, &ret->auth_timeout, kAuthTimeoutTag,
                             ret->timeout) ||
      !SSL_SESSION_parse_octet_string(&session, &ret->early_alpn,
                                      kEarlyALPNTag) ||
      !CBS_get_optional_asn1_bool(&session, &is_quic, kIsQuicTag,
                                  /*default_value=*/false) ||
      !SSL_SESSION_parse_octet_string(&session, &ret->quic_early_data_context,
                                      kQuicEarlyDataContextTag)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }

  CBS settings;
  int has_local_alps, has_peer_alps, is_resumable_across_names;
  if (!CBS_get_optional_asn1_octet_string(&session, &settings, &has_local_alps,
                                          kLocalALPSTag) ||
      !ret->local_application_settings.CopyFrom(settings) ||
      !CBS_get_optional_asn1_octet_string(&session, &settings, &has_peer_alps,
                                          kPeerALPSTag) ||
      !ret->peer_application_settings.CopyFrom(settings) ||
      !CBS_get_optional_asn1_bool(&session, &is_resumable_across_names,
                                  kResumableAcrossNamesTag,
                                  /*default_value=*/false) ||
      CBS_len(&session) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }
  ret->is_quic = is_quic;
  ret->is_resumable_across_names = is_resumable_across_names;

  // The two ALPS values and ALPN must be consistent.
  if (has_local_alps != has_peer_alps ||
      (has_local_alps && ret->early_alpn.empty())) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }
  ret->has_application_settings = has_local_alps;

  if (!x509_method->session_cache_objects(ret.get())) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }

  return ret;
}